

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_upvalue_t * gravity_upvalue_new(gravity_vm *vm,gravity_value_t *value)

{
  gravity_object_t *obj;
  gravity_upvalue_t *upvalue;
  gravity_value_t *value_local;
  gravity_vm *vm_local;
  
  obj = (gravity_object_t *)gravity_calloc((gravity_vm *)0x0,1,0x50);
  obj->isa = gravity_class_upvalue;
  obj->objclass = (gravity_class_t *)value;
  obj->identifier = (char *)gravity_class_null;
  obj->has_outer = false;
  obj->is_struct = false;
  obj->is_inited = false;
  obj->unused = false;
  *(undefined4 *)&obj->field_0x44 = 0;
  obj->xdata = (void *)0x0;
  if (vm != (gravity_vm *)0x0) {
    gravity_vm_transfer(vm,obj);
  }
  return (gravity_upvalue_t *)obj;
}

Assistant:

gravity_upvalue_t *gravity_upvalue_new (gravity_vm *vm, gravity_value_t *value) {
    gravity_upvalue_t *upvalue = (gravity_upvalue_t *)mem_alloc(NULL, sizeof(gravity_upvalue_t));

    upvalue->isa = gravity_class_upvalue;
    upvalue->value = value;
    upvalue->closed = VALUE_FROM_NULL;
    upvalue->next = NULL;

    if (vm) gravity_vm_transfer(vm, (gravity_object_t*) upvalue);
    return upvalue;
}